

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::AsyncIoStreamWithInitialBuffer::tryRead
          (AsyncIoStreamWithInitialBuffer *this,void *buffer,size_t minBytes,size_t maxBytes)

{
  long *plVar1;
  Exception *in_R8;
  Exception *__n;
  Fault f;
  DebugComparison<unsigned_long_&,_unsigned_long_&> _kjCondition;
  Fault local_68;
  Exception *local_60;
  size_t local_58;
  DebugComparison<unsigned_long_&,_unsigned_long_&> local_50;
  
  local_50.right = &local_58;
  local_50.left = (unsigned_long *)&local_60;
  local_50.op.content.ptr = " >= ";
  local_50.op.content.size_ = 5;
  local_50.result = maxBytes <= in_R8;
  local_58 = maxBytes;
  if (local_50.result) {
    __n = *(Exception **)((long)buffer + 0x40);
    if (__n < maxBytes) {
      local_60 = in_R8;
      if (__n != (Exception *)0x0) {
        memcpy((void *)minBytes,*(void **)((long)buffer + 0x38),(size_t)__n);
        *(undefined8 *)((long)buffer + 0x38) = 0;
        *(undefined8 *)((long)buffer + 0x40) = 0;
        Array<unsigned_char>::dispose((Array<unsigned_char> *)((long)buffer + 0x20));
        local_58 = local_58 - (long)__n;
        local_60 = (Exception *)((long)local_60 - (long)__n);
      }
      (**(code **)(**(long **)((long)buffer + 0x18) + 8))
                (&local_50,*(long **)((long)buffer + 0x18),(long)__n->trace + (minBytes - 0x68));
      local_68.exception = __n;
      Promise<unsigned_long>::
      then<kj::AsyncIoStreamWithInitialBuffer::tryRead(void*,unsigned_long,unsigned_long)::_lambda(unsigned_long)_1_>
                ((Promise<unsigned_long> *)this,(anon_class_8_1_0bacd73b_for_func *)&local_50);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_50);
    }
    else {
      if (in_R8 < __n) {
        __n = in_R8;
      }
      memcpy((void *)minBytes,*(void **)((long)buffer + 0x38),(size_t)__n);
      *(long *)((long)buffer + 0x38) = (long)__n->trace + *(long *)((long)buffer + 0x38) + -0x68;
      plVar1 = (long *)((long)buffer + 0x40);
      *plVar1 = *plVar1 - (long)__n;
      if (*plVar1 == 0) {
        Array<unsigned_char>::dispose((Array<unsigned_char> *)((long)buffer + 0x20));
      }
      Promise<unsigned_long>::Promise((Promise<unsigned_long> *)this,(FixVoid<unsigned_long>)__n);
    }
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,unsigned_long&>&>
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
             ,0x11cf,FAILED,"maxBytes >= minBytes","_kjCondition,",&local_50);
  kj::_::Debug::Fault::fatal(&local_68);
}

Assistant:

Promise<size_t> tryRead(void* buffer, size_t minBytes, size_t maxBytes) override {
    KJ_REQUIRE(maxBytes >= minBytes);
    auto destination = static_cast<byte*>(buffer);

    // If there are at least minBytes available in the leftover buffer...
    if (leftover.size() >= minBytes) {
      // We are going to immediately read up to maxBytes from the leftover buffer...
      auto bytesToCopy = kj::min(maxBytes, leftover.size());
      memcpy(destination, leftover.begin(), bytesToCopy);
      leftover = leftover.slice(bytesToCopy, leftover.size());

      // If we've consumed all of the data in the leftover buffer, go ahead and free it.
      if (leftover.size() == 0) {
        leftoverBackingBuffer = nullptr;
      }

      return bytesToCopy;
    } else {
      // We know here that leftover.size() is less than minBytes, but it might not
      // be zero. Copy everything from leftover into the destination buffer then read
      // the rest from the underlying stream.
      auto bytesToCopy = leftover.size();
      KJ_DASSERT(bytesToCopy < minBytes);

      if (bytesToCopy > 0) {
        memcpy(destination, leftover.begin(), bytesToCopy);
        leftover = nullptr;
        leftoverBackingBuffer = nullptr;
        minBytes -= bytesToCopy;
        maxBytes -= bytesToCopy;
        KJ_DASSERT(minBytes >= 1);
        KJ_DASSERT(maxBytes >= minBytes);
      }

      return stream->tryRead(destination + bytesToCopy, minBytes, maxBytes)
          .then([bytesToCopy](size_t amount) { return amount + bytesToCopy; });
    }
  }